

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O1

void __thiscall
InvocationMeaning::TracePointers(InvocationMeaning *this,function<void_(Sexp_**)> *func)

{
  pointer ppSVar1;
  Sexp **arg;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *pvVar2;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *local_30;
  
  local_30 = (vector<Sexp_*,_std::allocator<Sexp_*>_> *)&this->base;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*func->_M_invoker)((_Any_data *)func,(Sexp ***)&local_30);
    pvVar2 = (vector<Sexp_*,_std::allocator<Sexp_*>_> *)
             (this->arguments).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppSVar1 = (this->arguments).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pvVar2 != (vector<Sexp_*,_std::allocator<Sexp_*>_> *)ppSVar1) {
      do {
        local_30 = pvVar2;
        if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00115849;
        (*func->_M_invoker)((_Any_data *)func,(Sexp ***)&local_30);
        pvVar2 = (vector<Sexp_*,_std::allocator<Sexp_*>_> *)
                 &(pvVar2->super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      } while (pvVar2 != (vector<Sexp_*,_std::allocator<Sexp_*>_> *)ppSVar1);
    }
    return;
  }
LAB_00115849:
  std::__throw_bad_function_call();
}

Assistant:

void TracePointers(std::function<void(Sexp **)> func) override {
    func(&base);
    for (auto &arg : arguments) {
      func(&arg);
    }
  }